

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O1

void __thiscall doctest::detail::logTestCrashed(detail *this)

{
  Color *this_00;
  char msg [1024];
  String local_410;
  char local_408 [1024];
  
  builtin_strncpy(local_408,"TEST CASE FAILED! (threw exception)\n\n",0x26);
  Color::use((Color *)this,Red);
  this_00 = (Color *)0x108421;
  printf("%s");
  Color::use(this_00,None);
  String::String(&local_410,local_408);
  free(local_410.m_str);
  return;
}

Assistant:

void logTestCrashed() {
        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];

        DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), "TEST CASE FAILED! (threw exception)\n\n");

        DOCTEST_PRINTF_COLORED(msg, Color::Red);

        printToDebugConsole(String(msg));
    }